

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O3

int libssh2_sftp_rename_ex
              (LIBSSH2_SFTP *sftp,char *source_filename,uint source_filename_len,char *dest_filename
              ,uint dest_filename_len,long flags)

{
  LIBSSH2_CHANNEL *channel;
  LIBSSH2_SESSION *pLVar1;
  uchar **buf;
  uint32_t uVar2;
  int iVar3;
  uchar *puVar4;
  ulong uVar5;
  char *errmsg;
  uint uVar6;
  size_t data_len;
  uchar *local_78;
  uchar **local_70;
  size_t local_68;
  long local_60;
  ulong local_58;
  ulong local_50;
  char *local_48;
  char *local_40;
  time_t local_38;
  
  if (sftp == (LIBSSH2_SFTP *)0x0) {
    return -0x27;
  }
  local_60 = flags;
  local_48 = source_filename;
  local_40 = dest_filename;
  local_38 = time((time_t *)0x0);
  local_70 = &sftp->rename_s;
  local_58 = (ulong)dest_filename_len;
  local_50 = (ulong)source_filename_len;
  do {
    channel = sftp->channel;
    pLVar1 = channel->session;
    local_68 = 0;
    uVar6 = source_filename_len + dest_filename_len + 0x11 + (uint)(4 < sftp->version) * 4;
    local_78 = (uchar *)0x0;
    if (sftp->rename_state == libssh2_NB_state_created) {
LAB_001266b8:
      uVar5 = _libssh2_channel_write
                        (channel,0,sftp->rename_packet,
                         (long)sftp->rename_s - (long)sftp->rename_packet);
      if (uVar5 != 0xffffffffffffffdb) {
        (*pLVar1->free)(sftp->rename_packet,&pLVar1->abstract);
        sftp->rename_packet = (uchar *)0x0;
        if (uVar5 == uVar6) {
          sftp->rename_state = libssh2_NB_state_sent;
          goto LAB_00126715;
        }
        sftp->rename_state = libssh2_NB_state_idle;
        iVar3 = -7;
        errmsg = "Unable to send FXP_RENAME command";
        goto LAB_00126827;
      }
    }
    else {
      if (sftp->rename_state == libssh2_NB_state_idle) {
        sftp->last_errno = 0;
        if (sftp->version < 2) {
          iVar3 = -0x1f;
          errmsg = "Server does not support RENAME";
        }
        else {
          puVar4 = (uchar *)(*pLVar1->alloc)((size_t)uVar6,&pLVar1->abstract);
          buf = local_70;
          sftp->rename_packet = puVar4;
          sftp->rename_s = puVar4;
          if (puVar4 != (uchar *)0x0) {
            _libssh2_store_u32(local_70,uVar6 - 4);
            puVar4 = sftp->rename_s;
            sftp->rename_s = puVar4 + 1;
            *puVar4 = '\x12';
            uVar2 = sftp->request_id;
            sftp->request_id = uVar2 + 1;
            sftp->rename_request_id = uVar2;
            _libssh2_store_u32(buf,uVar2);
            _libssh2_store_str(buf,local_48,local_50);
            _libssh2_store_str(buf,local_40,local_58);
            if (4 < sftp->version) {
              _libssh2_store_u32(local_70,(uint32_t)local_60);
            }
            sftp->rename_state = libssh2_NB_state_created;
            goto LAB_001266b8;
          }
          iVar3 = -6;
          errmsg = "Unable to allocate memory for FXP_RENAME packet";
        }
      }
      else {
LAB_00126715:
        iVar3 = sftp_packet_require(sftp,'e',sftp->rename_request_id,&local_78,&local_68,9);
        if (iVar3 == 0) {
          sftp->rename_state = libssh2_NB_state_idle;
          uVar2 = _libssh2_ntohu32(local_78 + 5);
          (*pLVar1->free)(local_78,&pLVar1->abstract);
          sftp->last_errno = uVar2;
          if (uVar2 == 8) {
            iVar3 = -0x1f;
            errmsg = "Operation Not Supported";
          }
          else if (uVar2 == 0xb) {
            iVar3 = -0x1f;
            errmsg = "File already exists and SSH_FXP_RENAME_OVERWRITE not specified";
          }
          else {
            if (uVar2 == 0) {
              return 0;
            }
            iVar3 = -0x1f;
            errmsg = "SFTP Protocol Error";
          }
        }
        else {
          if (iVar3 == -0x25) goto LAB_00126831;
          if (iVar3 == -0x26) {
            if (local_68 != 0) {
              (*pLVar1->free)(local_78,&pLVar1->abstract);
            }
            iVar3 = -0x1f;
            errmsg = "SFTP rename packet too short";
          }
          else {
            sftp->rename_state = libssh2_NB_state_idle;
            errmsg = "Error waiting for FXP STATUS";
          }
        }
      }
LAB_00126827:
      iVar3 = _libssh2_error(pLVar1,iVar3,errmsg);
      if (iVar3 != -0x25) {
        return iVar3;
      }
    }
LAB_00126831:
    pLVar1 = sftp->channel->session;
    if (pLVar1 == (LIBSSH2_SESSION *)0x0) {
      return -0x25;
    }
    if (pLVar1->api_block_mode == 0) {
      return -0x25;
    }
    iVar3 = _libssh2_wait_socket(pLVar1,local_38);
    if (iVar3 != 0) {
      return iVar3;
    }
  } while( true );
}

Assistant:

LIBSSH2_API int
libssh2_sftp_rename_ex(LIBSSH2_SFTP *sftp, const char *source_filename,
                       unsigned int source_filename_len,
                       const char *dest_filename,
                       unsigned int dest_filename_len, long flags)
{
    int rc;
    if(!sftp)
        return LIBSSH2_ERROR_BAD_USE;
    BLOCK_ADJUST(rc, sftp->channel->session,
                 sftp_rename(sftp, source_filename, source_filename_len,
                             dest_filename, dest_filename_len, flags));
    return rc;
}